

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeScissorTest
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,WindowRectangle *scissorRect)

{
  bool bVar1;
  int local_2c;
  int fragNdx;
  int regSampleNdx;
  WindowRectangle *scissorRect_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  for (local_2c = 0; local_2c < 0x40; local_2c = local_2c + 1) {
    if (((this->m_sampleRegister[local_2c].isAlive & 1U) != 0) &&
       (bVar1 = isInsideRect(&inputFragments[fragNdxOffset + local_2c / numSamplesPerFragment].
                              pixelCoord,scissorRect), !bVar1)) {
      this->m_sampleRegister[local_2c].isAlive = false;
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeScissorTest (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const WindowRectangle& scissorRect)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int fragNdx = fragNdxOffset + regSampleNdx/numSamplesPerFragment;

			if (!isInsideRect(inputFragments[fragNdx].pixelCoord, scissorRect))
				m_sampleRegister[regSampleNdx].isAlive = false;
		}
	}
}